

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O2

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  DecodeStatus DVar1;
  void *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar2;
  undefined3 in_register_00000081;
  
  uVar2 = insn >> 0x19 & 0x1f;
  Decoder_00 = Decoder;
  Address_00 = Address;
  if (((CONCAT31(in_register_00000081,isLoad) == 0) ||
      (DVar1 = (*DecodeRD)(MI,uVar2,Address,Decoder), Address_00 = extraout_RDX,
      DVar1 == MCDisassembler_Success)) &&
     (DVar1 = DecodeIntRegsRegisterClass(MI,insn >> 0xe & 0x1f,Address_00,Decoder_00),
     DVar1 == MCDisassembler_Success)) {
    if ((insn >> 0xd & 1) == 0) {
      DVar1 = DecodeIntRegsRegisterClass(MI,insn & 0x1f,Address_01,Decoder_00);
      if (DVar1 != MCDisassembler_Success) {
        return DVar1;
      }
    }
    else {
      MCOperand_CreateImm0
                (MI,(ulong)(uint)((int)(insn << 0x13) >> 0x13 & (int)(insn << 0x12) >> 0x1f));
    }
    if ((isLoad) || (DVar1 = (*DecodeRD)(MI,uVar2,Address,Decoder), DVar1 == MCDisassembler_Success)
       ) {
      DVar1 = MCDisassembler_Success;
    }
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder,
		bool isLoad, DecodeFunc DecodeRD)
{
	DecodeStatus status;
	unsigned rd = fieldFromInstruction_4(insn, 25, 5);
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	bool isImm = fieldFromInstruction_4(insn, 13, 1) != 0;
	unsigned rs2 = 0;
	unsigned simm13 = 0;

	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	if (isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	// Decode rs1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode imm|rs2.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	if (!isLoad) {
		status = DecodeRD(MI, rd, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}